

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::startCallback(Highs *this,HighsCallbackType callback_type)

{
  ulong *puVar1;
  HighsStatus HVar2;
  
  HVar2 = kError;
  if (callback_type < kNumCallbackType) {
    if ((this->callback_).user_callback.super__Function_base._M_manager == (_Manager_type)0x0) {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                   "Cannot start callback when user_callback not defined\n");
    }
    else {
      puVar1 = (this->callback_).active.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      *puVar1 = *puVar1 | 1L << ((byte)callback_type & 0x3f);
      HVar2 = kOk;
      if (callback_type == kCallbackLogging) {
        (this->options_).super_HighsOptionsStruct.log_options.user_callback_active = true;
        HVar2 = kOk;
      }
    }
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::startCallback(const HighsCallbackType callback_type) {
  const bool callback_type_ok =
      callback_type >= kCallbackMin && callback_type <= kCallbackMax;
  assert(callback_type_ok);
  if (!callback_type_ok) return HighsStatus::kError;
  if (!this->callback_.user_callback) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Cannot start callback when user_callback not defined\n");
    return HighsStatus::kError;
  }
  assert(int(this->callback_.active.size()) == kNumCallbackType);
  this->callback_.active[callback_type] = true;
  // Possibly modify the logging callback activity
  if (callback_type == kCallbackLogging)
    options_.log_options.user_callback_active = true;
  return HighsStatus::kOk;
}